

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O3

IOUAmount __thiscall jbcoin::STAmount::iou(STAmount *this)

{
  IOUAmount IVar1;
  IOUAmount local_18;
  
  if (this->mIsNative != true) {
    local_18.mantissa_ = -this->mValue;
    if (this->mIsNegative == false) {
      local_18.mantissa_ = this->mValue;
    }
    local_18.exponent_ = this->mOffset;
    IOUAmount::normalize(&local_18);
    IVar1.exponent_ = local_18.exponent_;
    IVar1.mantissa_ = local_18.mantissa_;
    IVar1._12_4_ = 0;
    return IVar1;
  }
  Throw<std::logic_error,char_const(&)[43]>
            ((char (*) [43])"Cannot return native STAmount as IOUAmount");
}

Assistant:

IOUAmount STAmount::iou () const
{
    if (mIsNative)
        Throw<std::logic_error> ("Cannot return native STAmount as IOUAmount");

    auto mantissa = static_cast<std::int64_t> (mValue);
    auto exponent = mOffset;

    if (mIsNegative)
        mantissa = -mantissa;

    return { mantissa, exponent };
}